

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void StoreTrivialContextMap
               (size_t num_types,size_t context_bits,HuffmanTree *tree,size_t *storage_ix,
               uint8_t *storage)

{
  ulong uVar1;
  byte bVar2;
  ushort uVar3;
  ulong histogram_length;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined8 local_7b0;
  uint8_t depths [272];
  uint16_t bits [272];
  uint32_t histogram [272];
  
  StoreVarLenUint8(num_types - 1,storage_ix,storage);
  if (1 < num_types) {
    lVar8 = context_bits - 1;
    histogram_length = (context_bits + num_types) - 1;
    local_7b0 = tree;
    memset(histogram,0,histogram_length * 4);
    uVar7 = *storage_ix;
    *(ulong *)(storage + (uVar7 >> 3)) = (ulong)storage[uVar7 >> 3] | 1L << ((byte)uVar7 & 7);
    uVar1 = uVar7 + 1;
    *storage_ix = uVar1;
    *(size_t *)(storage + (uVar1 >> 3)) =
         context_bits - 2 << ((byte)uVar1 & 7) | (ulong)storage[uVar1 >> 3];
    *storage_ix = uVar7 + 5;
    histogram[context_bits - 1] = (uint32_t)num_types;
    histogram[0] = 1;
    if (context_bits < histogram_length) {
      sVar4 = 0;
      do {
        histogram[context_bits + sVar4] = 1;
        sVar4 = sVar4 + 1;
      } while (num_types - 1 != sVar4);
    }
    BuildAndStoreHuffmanTree
              (histogram,histogram_length,histogram_length,local_7b0,depths,bits,storage_ix,storage)
    ;
    bVar2 = depths[context_bits - 1];
    uVar3 = bits[context_bits - 1];
    lVar6 = 0;
    do {
      lVar5 = lVar8 + lVar6;
      if (lVar6 == 0) {
        lVar5 = 0;
      }
      uVar1 = *storage_ix;
      uVar7 = depths[lVar5] + uVar1;
      *(ulong *)(storage + (uVar1 >> 3)) =
           (ulong)bits[lVar5] << ((byte)uVar1 & 7) | (ulong)storage[uVar1 >> 3];
      *storage_ix = uVar7;
      *(ulong *)(storage + (uVar7 >> 3)) =
           (ulong)uVar3 << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
      uVar7 = uVar7 + bVar2;
      *storage_ix = uVar7;
      *(ulong *)(storage + (uVar7 >> 3)) =
           (ulong)(uint)~(-1 << ((byte)lVar8 & 0x1f)) << ((byte)uVar7 & 7) |
           (ulong)storage[uVar7 >> 3];
      *storage_ix = uVar7 + lVar8;
      lVar6 = lVar6 + 1;
    } while (num_types + (num_types == 0) != lVar6);
    uVar1 = *storage_ix;
    *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3] | 1L << ((byte)uVar1 & 7);
    *storage_ix = uVar1 + 1;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, alphabet_size,
                             tree, depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}